

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_first_by_single_char_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_first_by_single_char_Test<char16_t> *this)

{
  char16_t **this_00;
  bool bVar1;
  char16_t delim;
  char16_t *__str;
  char *pcVar2;
  const_reference pvVar3;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_R9;
  AssertionHelper local_6b8;
  Fixed local_688;
  char16_t *local_500;
  undefined1 local_4f8 [8];
  AssertionResult iutest_ar_2;
  Fixed local_4a0;
  char16_t *local_318;
  undefined1 local_310 [8];
  AssertionResult iutest_ar_1;
  string local_2e0;
  AssertionHelper local_2c0;
  Fixed local_290;
  size_type local_f8;
  uint local_f0;
  ExpressionDecomposer local_e9;
  ExpressionLHS<unsigned_int> local_e8;
  ExpressionResult local_c0;
  AssertionResult local_98;
  undefined1 local_70 [8];
  AssertionResult iutest_ar;
  undefined1 local_40 [8];
  array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> re;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_at_first_by_single_char_Test<char16_t> *this_local;
  
  __str = constant::cpp_type_data2<char16_t>();
  this_00 = &re._M_elems[1]._M_str;
  std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::basic_string_view
            ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)this_00,__str);
  delim = constant::space<char16_t>();
  iutest_ar._36_2_ = split<char16_t,_nullptr>(delim);
  at_first();
  iutest_ar._38_2_ =
       detail::split_helper<char16_t,_true,_false,_false>::
       operator>><detail::split_at_first,_nullptr>
                 ((split_helper<char16_t,_true,_false,_false> *)&iutest_ar.field_0x24);
  detail::
  operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char16_t,_nullptr>
            ((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> *)local_40,
             (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)this_00,
             (split_helper_subroutine<detail::split_at_first,_char16_t,_char16_t> *)
             &iutest_ar.field_0x26);
  iutest::detail::AlwaysZero();
  local_f0 = 2;
  iutest::detail::ExpressionDecomposer::operator->*(&local_e8,&local_e9,&local_f0);
  local_f8 = std::array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>::size
                       ((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> *
                        )local_40);
  iutest::detail::ExpressionLHS<unsigned_int>::operator==(&local_c0,&local_e8,&local_f8);
  iutest::detail::ExpressionResult::GetResult(&local_98,&local_c0,true);
  iutest::AssertionResult::Is((AssertionResult *)local_70,&local_98);
  iutest::AssertionResult::~AssertionResult(&local_98);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_c0);
  iutest::detail::ExpressionLHS<unsigned_int>::~ExpressionLHS(&local_e8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    memset(&local_290,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_290);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)local_70,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((2u == re.size()))",
               "false","true",(char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_2c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x71,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_2c0,&local_290);
    iutest::AssertionHelper::~AssertionHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_290);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_318 = constant::cpp_dxle_sound_c<char16_t>();
    pvVar3 = std::array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>::
             operator[]((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> *
                        )local_40,0);
    iutest::internal::EqHelper<false>::
    Compare<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
              ((AssertionResult *)local_310,
               (EqHelper<false> *)"constant::cpp_dxle_sound_c<char_type>()","re[0]",
               (char *)&local_318,(char16_t **)pvVar3,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
    if (!bVar1) {
      memset(&local_4a0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_4a0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_310);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
                 ,0x72,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_4a0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_4a0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_310);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      local_500 = constant::cpp_LoadSoundMem<char16_t>();
      pvVar3 = std::array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>::
               operator[]((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>
                           *)local_40,1);
      iutest::internal::EqHelper<false>::
      Compare<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
                ((AssertionResult *)local_4f8,
                 (EqHelper<false> *)"constant::cpp_LoadSoundMem<char_type>()","re[1]",
                 (char *)&local_500,(char16_t **)pvVar3,in_R9);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
      if (!bVar1) {
        memset(&local_688,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_688);
        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4f8);
        iutest::AssertionHelper::AssertionHelper
                  (&local_6b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
                   ,0x73,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_6b8,&local_688);
        iutest::AssertionHelper::~AssertionHelper(&local_6b8);
        iutest::AssertionHelper::Fixed::~Fixed(&local_688);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
    }
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_first_by_single_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::cpp_type_data2<char_type>();
	const auto re = s | split(constant::space<char_type>()) >> at_first();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::cpp_dxle_sound_c<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::cpp_LoadSoundMem<char_type>(), re[1]);
}